

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O2

void __thiscall
PatternAddressMapper::export_pattern_internal
          (PatternAddressMapper *this,vector<Aggressor,_std::allocator<Aggressor>_> *aggressors,
          int base_period,vector<volatile_char_*,_std::allocator<volatile_char_*>_> *addresses,
          vector<int,_std::allocator<int>_> *rows)

{
  size_type sVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  pointer pAVar4;
  unordered_map<int,_DRAMAddr,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DRAMAddr>_>_>
  *this_00;
  ulong uVar5;
  stringstream local_220 [8];
  stringstream pattern_str;
  ostream local_210;
  string local_98;
  ulong local_78;
  vector<char_volatile*,std::allocator<char_volatile*>> *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  ulong local_60;
  string local_58;
  allocator<char> local_35;
  int local_34 [2];
  value_type agg;
  
  local_70 = (vector<char_volatile*,std::allocator<char_volatile*>> *)addresses;
  local_68 = rows;
  std::__cxx11::stringstream::stringstream(local_220);
  local_78 = (ulong)base_period;
  this_00 = &this->aggressor_to_addr;
  local_60 = 0;
  for (uVar5 = 0;
      pAVar4 = (aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pAVar4 >> 2);
      uVar5 = uVar5 + 1) {
    if ((uVar5 != 0) && (uVar5 % local_78 == 0)) {
      std::endl<char,std::char_traits<char>>(&local_210);
      pAVar4 = (aggressors->super__Vector_base<Aggressor,_std::allocator<Aggressor>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    local_34[0] = pAVar4[uVar5].id;
    if (local_34[0] == -1) {
      poVar3 = std::operator<<(&local_210,"\x1b[0;31m");
      poVar3 = std::operator<<(poVar3,"-1");
      local_60 = CONCAT71((int7)((ulong)pAVar4 >> 8),1);
      std::operator<<(poVar3,"\x1b[0m");
    }
    else {
      sVar1 = std::
              _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&this_00->_M_h,local_34);
      if (sVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,
                   "Could not find a valid address mapping for aggressor with ID %d.",&local_35);
        format_string<int>(&local_58,&local_98,local_34[0]);
        Logger::log_error(&local_58,true);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        pmVar2 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)this_00,local_34);
        local_58._M_dataplus._M_p = (pointer)DRAMAddr::to_virt(pmVar2);
        std::vector<char_volatile*,std::allocator<char_volatile*>>::emplace_back<char_volatile*>
                  (local_70,(char **)&local_58);
        pmVar2 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)this_00,local_34);
        local_58._M_dataplus._M_p._0_4_ = (int)pmVar2->row;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_68,(int *)&local_58);
        std::__detail::
        _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)this_00,local_34);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_210);
        std::operator<<(poVar3," ");
      }
    }
  }
  if ((local_60 & 1) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "Found at least an invalid aggressor in the pattern. These aggressors were NOT added but printed to visualize their position."
               ,(allocator<char> *)&local_98);
    Logger::log_error(&local_58,true);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::stringbuf::str();
    Logger::log_data(&local_58,true);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::stringstream::~stringstream(local_220);
  return;
}

Assistant:

void PatternAddressMapper::export_pattern_internal(
    std::vector<Aggressor> &aggressors, int base_period,
    std::vector<volatile char *> &addresses,
    std::vector<int> &rows) {

  bool invalid_aggs = false;
  std::stringstream pattern_str;
  for (size_t i = 0; i < aggressors.size(); ++i) {
    // for better visualization: add linebreak after each base period
    if (i!=0 && (i%base_period)==0) {
      pattern_str << std::endl;
    }

    // check whether this is a valid aggressor, i.e., the aggressor's ID != -1
    auto agg = aggressors[i];
    if (agg.id==ID_PLACEHOLDER_AGG) {
      pattern_str << FC_RED << "-1" << F_RESET;
      invalid_aggs = true;
      continue;
    }

    // check whether there exists a aggressor ID -> address mapping before trying to access it
    if (aggressor_to_addr.count(agg.id)==0) {
      Logger::log_error(format_string("Could not find a valid address mapping for aggressor with ID %d.", agg.id));
      continue;
    }

    // retrieve virtual address of current aggressor in pattern and add it to output vector
    addresses.push_back((volatile char *) aggressor_to_addr.at(agg.id).to_virt());
    rows.push_back(static_cast<int>(aggressor_to_addr.at(agg.id).row));
    pattern_str << aggressor_to_addr.at(agg.id).row << " ";
  }

  // print string representation of pattern
//  Logger::log_info("Pattern filled by random DRAM rows:");
//  Logger::log_data(pattern_str.str());

  if (invalid_aggs) {
    Logger::log_error(
        "Found at least an invalid aggressor in the pattern. "
        "These aggressors were NOT added but printed to visualize their position.");
    Logger::log_data(pattern_str.str());
  }
}